

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_mike_4.h
# Opt level: O1

void __thiscall PlayerMike_4::~PlayerMike_4(PlayerMike_4 *this)

{
  pointer piVar1;
  pointer pcVar2;
  
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__PlayerMike_4_0010cc08;
  piVar1 = (this->m_predict).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  (this->super_Player)._vptr_Player = (_func_int **)&PTR__Player_0010c820;
  pcVar2 = (this->super_Player).m_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_Player).m_name.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

PlayerMike_4(const std::string& name) :
      Player(name),
      m_predict(27*9)
   {}